

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::SelectBinder::BindUnnest
          (BindResult *__return_storage_ptr__,SelectBinder *this,FunctionExpression *function,
          idx_t depth,bool root_expression)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  idx_t *piVar1;
  LogicalTypeId LVar2;
  Binder *binder;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  size_type sVar4;
  pointer pcVar5;
  BoundSelectNode *pBVar6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  ClientContext *pCVar9;
  pointer ppVar10;
  long *plVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  bool bVar14;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var15;
  SelectBinder *this_01;
  _Head_base<0UL,_duckdb::BoundUnnestExpression_*,_false> _Var16;
  undefined1 uVar17;
  bool bVar18;
  int iVar19;
  uint32_t uVar20;
  pointer pOVar21;
  reference pvVar22;
  pointer pPVar23;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar24;
  type pEVar25;
  type pPVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  pointer pEVar28;
  LogicalType *pLVar29;
  LogicalType *pLVar30;
  BoundUnnestExpression *this_02;
  pointer pBVar31;
  __node_base_ptr p_Var32;
  child_list_t<LogicalType> *pcVar33;
  undefined7 extraout_var;
  ParameterNotAllowedException *this_03;
  InvalidInputException *this_04;
  BinderException *pBVar34;
  ParameterNotResolvedException *this_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *key;
  ulong uVar35;
  _Hash_node_base *p_Var36;
  pointer ppVar37;
  uint uVar38;
  ulong uVar39;
  _Alloc_hider _Var40;
  _Hash_node_base *p_Var41;
  undefined7 in_register_00000081;
  __node_base_ptr p_Var42;
  undefined1 *puVar43;
  size_type __n;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 auVar46 [8];
  _Alloc_hider this_06;
  type unnest_expr;
  string alias;
  templated_unique_single_t result_1;
  BoundUnnestNode unnest_node;
  Value value;
  LogicalType return_type;
  ErrorData error;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_3e0;
  string local_3d8;
  undefined1 *local_3b8;
  SelectBinder *local_3b0;
  BindResult *local_3a8;
  uint local_39c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  _Head_base<0UL,_duckdb::BoundUnnestExpression_*,_false> local_390;
  undefined1 local_388 [8];
  undefined1 auStack_380 [32];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_360;
  undefined1 local_358 [8];
  undefined1 auStack_350 [8];
  undefined1 local_348 [32];
  _Alloc_hider local_328;
  char local_318 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_308 [64];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2c0;
  idx_t local_2b8;
  undefined1 *local_2b0;
  LogicalType local_2a8;
  ErrorData local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined1 local_1f0 [128];
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  char local_118 [16];
  _Alloc_hider local_108;
  char local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  __node_base local_d8;
  size_type local_d0;
  _Prime_rehash_policy local_c8;
  __node_base_ptr local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [8];
  
  local_3a8 = __return_storage_ptr__;
  local_2b8 = depth;
  if (depth != 0) {
    local_358 = (undefined1  [8])local_348;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"UNNEST() for correlated expressions is not supported yet","");
    BinderException::BinderException<>
              ((BinderException *)&local_290,&function->super_ParsedExpression,(string *)local_358);
    BindResult::BindResult(local_3a8,(Exception *)&local_290);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_290);
    _Var40._M_p = (pointer)local_358;
    if (local_358 == (undefined1  [8])local_348) {
      return local_3a8;
    }
    goto LAB_00da422f;
  }
  local_39c = (uint)CONCAT71(in_register_00000081,root_expression);
  local_3b0 = this;
  ErrorData::ErrorData(&local_290);
  if ((function->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (function->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_358 = (undefined1  [8])local_348;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"UNNEST() requires a single argument","");
    BinderException::BinderException<>
              ((BinderException *)&local_3d8,&function->super_ParsedExpression,(string *)local_358);
    BindResult::BindResult(local_3a8,(Exception *)&local_3d8);
LAB_00da431b:
    ::std::runtime_error::~runtime_error((runtime_error *)&local_3d8);
LAB_00da4325:
    if (local_358 != (undefined1  [8])local_348) {
LAB_00da4332:
      operator_delete((void *)local_358);
    }
  }
  else if ((local_3b0->super_BaseSelectBinder).inside_window == true) {
    (*(local_3b0->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[0xe])
              (local_358);
    BinderException::BinderException<>
              ((BinderException *)&local_3d8,&function->super_ParsedExpression,(string *)local_358);
    BindResult::BindResult(local_3a8,(Exception *)&local_3d8);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_3d8);
    if (local_358 != (undefined1  [8])local_348) goto LAB_00da4332;
  }
  else {
    if (((function->distinct != false) ||
        ((function->filter).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
         (ParsedExpression *)0x0)) ||
       (pOVar21 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(&function->order_bys),
       (pOVar21->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pOVar21->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      this_04 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_358 = (undefined1  [8])local_348;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,
                 "\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not applicable to \"UNNEST\"","");
      InvalidInputException::InvalidInputException(this_04,(string *)local_358);
      __cxa_throw(this_04,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = &function->children;
    local_3b8 = &DAT_00000001;
    if ((long)(function->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(function->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 8) {
      if ((ulong)((long)(function->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(function->children).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 9) {
        bVar18 = true;
        local_3b8 = &DAT_00000001;
        bVar14 = false;
      }
      else {
        local_3b8 = &DAT_00000001;
        bVar14 = false;
        __n = 1;
        do {
          if (bVar14) {
            local_358 = (undefined1  [8])local_348;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_358,"UNNEST() only supports a single additional argument","")
            ;
            BinderException::BinderException<>
                      ((BinderException *)&local_3d8,&function->super_ParsedExpression,
                       (string *)local_358);
            BindResult::BindResult(local_3a8,(Exception *)&local_3d8);
            ::std::runtime_error::~runtime_error((runtime_error *)&local_3d8);
            if (local_358 != (undefined1  [8])local_348) {
              operator_delete((void *)local_358);
            }
            bVar18 = false;
            goto LAB_00da5346;
          }
          pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this_00,__n);
          pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar22);
          iVar19 = (*(pPVar23->super_BaseExpression)._vptr_BaseExpression[6])(pPVar23);
          if ((char)iVar19 != '\0') {
            this_03 = (ParameterNotAllowedException *)__cxa_allocate_exception(0x10);
            local_358 = (undefined1  [8])local_348;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_358,"Parameter not allowed in unnest parameter","");
            ParameterNotAllowedException::ParameterNotAllowedException(this_03,(string *)local_358);
            __cxa_throw(this_03,&ParameterNotAllowedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this_00,__n);
          pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar22);
          iVar19 = (*(pPVar23->super_BaseExpression)._vptr_BaseExpression[5])(pPVar23);
          local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_398._4_4_,2);
          if ((char)iVar19 == '\0') break;
          pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this_00,__n);
          pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(pvVar22);
          StringUtil::Lower(&local_3d8,(string *)&(pPVar23->super_BaseExpression).alias);
          pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this_00,__n);
          ExpressionBinder::BindChild((ExpressionBinder *)local_3b0,pvVar22,local_2b8,&local_290);
          if ((runtime_error)local_290.initialized == (runtime_error)0x1) {
            local_1f0[0] = local_290.initialized;
            local_1f0[1] = local_290.type;
            if (local_290.raw_message._M_dataplus._M_p == (pointer)((long)&local_290 + 0x18U)) {
              local_1f0._32_4_ = local_290.raw_message.field_2._8_4_;
              local_1f0._36_4_ = local_290.raw_message.field_2._12_4_;
              local_1f0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_1f0 + 0x18);
            }
            else {
              local_1f0._8_8_ = local_290.raw_message._M_dataplus._M_p;
            }
            local_1f0._28_4_ = local_290.raw_message.field_2._M_allocated_capacity._4_4_;
            local_1f0._24_4_ = local_290.raw_message.field_2._M_allocated_capacity._0_4_;
            local_1f0._16_8_ = local_290.raw_message._M_string_length;
            local_290.raw_message._M_string_length = 0;
            local_290.raw_message.field_2._M_allocated_capacity._0_4_ =
                 local_290.raw_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            if (local_290.final_message._M_dataplus._M_p == (pointer)((long)&local_290 + 0x38U)) {
              local_1f0._64_4_ = local_290.final_message.field_2._8_4_;
              local_1f0._68_4_ = local_290.final_message.field_2._12_4_;
              local_1f0._40_8_ = local_1f0 + 0x38;
            }
            else {
              local_1f0._40_8_ = local_290.final_message._M_dataplus._M_p;
            }
            local_1f0._60_4_ = local_290.final_message.field_2._M_allocated_capacity._4_4_;
            local_1f0._56_4_ = local_290.final_message.field_2._M_allocated_capacity._0_4_;
            local_1f0._48_8_ = local_290.final_message._M_string_length;
            local_290.final_message._M_string_length = 0;
            local_290.final_message.field_2._M_allocated_capacity._0_4_ =
                 local_290.final_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
            local_290.raw_message._M_dataplus._M_p = (pointer)((long)&local_290 + 0x18U);
            local_290.final_message._M_dataplus._M_p = (pointer)((long)&local_290 + 0x38U);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(local_1f0 + 0x48),(long)&local_290 + 0x48);
            BindResult::BindResult(local_3a8,(ErrorData *)local_1f0);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_1f0 + 0x48));
            if ((undefined1 *)local_1f0._40_8_ != local_1f0 + 0x38) {
              operator_delete((void *)local_1f0._40_8_);
            }
            iVar19 = 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._8_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1f0 + 0x18)) {
              operator_delete((void *)local_1f0._8_8_);
            }
          }
          else {
            pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::operator[](this_00,__n);
            pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(pvVar22);
            puVar24 = BoundExpression::GetExpression(pPVar26);
            pCVar9 = (local_3b0->super_BaseSelectBinder).super_ExpressionBinder.context;
            pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*(puVar24);
            ExpressionExecutor::EvaluateScalar((Value *)local_358,pCVar9,pEVar25,true);
            iVar19 = ::std::__cxx11::string::compare((char *)&local_3d8);
            if (iVar19 == 0) {
              bVar18 = Value::GetValue<bool>((Value *)local_358);
              if (bVar18) {
                local_3b8 = (undefined1 *)0xffffffffffffffff;
              }
LAB_00da486d:
              iVar19 = 0;
              bVar14 = true;
            }
            else {
              iVar19 = ::std::__cxx11::string::compare((char *)&local_3d8);
              if (iVar19 == 0) {
                uVar20 = Value::GetValue<unsigned_int>((Value *)local_358);
                if (uVar20 == 0) {
                  pBVar34 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_388 = (undefined1  [8])(auStack_380 + 8);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_388,"UNNEST cannot have a max depth of 0","");
                  BinderException::BinderException(pBVar34,(string *)local_388);
                  __cxa_throw(pBVar34,&BinderException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                local_3b8 = (undefined1 *)(ulong)uVar20;
                goto LAB_00da486d;
              }
              iVar19 = 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_string_length !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                pBVar34 = (BinderException *)__cxa_allocate_exception(0x10);
                local_388 = (undefined1  [8])(auStack_380 + 8);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_388,"Unsupported parameter \"%s\" for unnest","");
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,local_3d8._M_dataplus._M_p,
                           (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)(local_3d8._M_string_length + (long)local_3d8._M_dataplus._M_p));
                BinderException::BinderException<std::__cxx11::string>
                          (pBVar34,(string *)local_388,&local_150);
                __cxa_throw(pBVar34,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
            }
            Value::~Value((Value *)local_358);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          if (iVar19 != 0) {
            local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_398._4_4_,iVar19);
            break;
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)(function->children).
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(function->children).
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
        bVar18 = (int)local_398 == 2;
      }
LAB_00da5346:
      if (!bVar18) goto LAB_00da4337;
      if (!bVar14) {
        local_358 = (undefined1  [8])local_348;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,
                   "UNNEST - unsupported extra argument, unnest only supports recursive := [true/false] or max_depth := #"
                   ,"");
        BinderException::BinderException<>
                  ((BinderException *)&local_3d8,&function->super_ParsedExpression,
                   (string *)local_358);
        BindResult::BindResult(local_3a8,(Exception *)&local_3d8);
        goto LAB_00da431b;
      }
    }
    this_01 = local_3b0;
    local_3b0->unnest_level = local_3b0->unnest_level + 1;
    pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_00,0);
    ExpressionBinder::BindChild((ExpressionBinder *)this_01,pvVar22,local_2b8,&local_290);
    if ((runtime_error)local_290.initialized == (runtime_error)0x1) {
      pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[](this_00,0);
      local_130[0] = local_290.initialized;
      local_130[1] = local_290.type;
      local_128._M_p = local_118;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_290.raw_message._M_dataplus._M_p,
                 (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(local_290.raw_message._M_dataplus._M_p + local_290.raw_message._M_string_length
                    ));
      local_108._M_p = local_f8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_290.final_message._M_dataplus._M_p,
                 local_290.final_message._M_dataplus._M_p + local_290.final_message._M_string_length
                );
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ = local_290.extra_info._M_h._M_bucket_count;
      local_d8._M_nxt = (_Hash_node_base *)0x0;
      local_d0 = local_290.extra_info._M_h._M_element_count;
      local_c8._M_max_load_factor = local_290.extra_info._M_h._M_rehash_policy._M_max_load_factor;
      local_c8._4_4_ = local_290.extra_info._M_h._M_rehash_policy._4_4_;
      local_c8._M_next_resize = local_290.extra_info._M_h._M_rehash_policy._M_next_resize;
      local_b8 = (__node_base_ptr)0x0;
      local_3d8._M_dataplus._M_p = (pointer)&local_e8;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_e8._M_local_buf,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)&local_290 + 0x48),
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)&local_3d8);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)local_358,(ExpressionBinder *)local_3b0,pvVar22,
                 (ErrorData *)local_130);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_e8._M_local_buf);
      if (local_108._M_p != local_f8) {
        operator_delete(local_108._M_p);
      }
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
      }
      uVar17 = auStack_350[0];
      if ((bool)auStack_350[0] == true) {
        ErrorData::ErrorData((ErrorData *)local_b0,(ErrorData *)auStack_350);
        BindResult::BindResult(local_3a8,(ErrorData *)local_b0);
        ErrorData::~ErrorData((ErrorData *)local_b0);
      }
      else {
        pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[](this_00,0);
        pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar22);
        puVar24 = BoundExpression::GetExpression(pPVar26);
        binder = (local_3b0->super_BaseSelectBinder).super_ExpressionBinder.binder;
        pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar24);
        ExpressionBinder::ExtractCorrelatedExpressions(binder,pEVar25);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_308);
      if (local_328._M_p != local_318) {
        operator_delete(local_328._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_348 + 0x10)) {
        operator_delete((void *)local_348._0_8_);
      }
      if (local_358 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_358 + 8))();
      }
      if ((bool)uVar17 != false) goto LAB_00da4337;
    }
    pvVar22 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_00,0);
    pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar22);
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)BoundExpression::GetExpression(pPVar26);
    pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&paVar27->_M_allocated_capacity);
    piVar1 = &local_3b0->unnest_level;
    *piVar1 = *piVar1 - 1;
    if (*piVar1 != 0) {
      pBVar34 = (BinderException *)__cxa_allocate_exception(0x10);
      local_358 = (undefined1  [8])local_348;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,
                 "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels"
                 ,"");
      BinderException::BinderException<>
                (pBVar34,&function->super_ParsedExpression,(string *)local_358);
      __cxa_throw(pBVar34,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pLVar30 = &pEVar28->return_type;
    LVar2 = pLVar30->id_;
    if ((1 < LVar2 - 100) && (LVar2 != SQLNULL)) {
      if (LVar2 == UNKNOWN) {
        this_05 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
        ParameterNotResolvedException::ParameterNotResolvedException(this_05);
        __cxa_throw(this_05,&ParameterNotResolvedException::typeinfo,
                    ::std::runtime_error::~runtime_error);
      }
      local_358 = (undefined1  [8])local_348;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,
                 "UNNEST() can only be applied to lists, structs and NULL, not %s","");
      LogicalType::ToString_abi_cxx11_(&local_170,pLVar30);
      BinderException::BinderException<std::__cxx11::string>
                ((BinderException *)&local_3d8,&function->super_ParsedExpression,(string *)local_358
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170);
      BindResult::BindResult(local_3a8,(Exception *)&local_3d8);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_3d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      goto LAB_00da4325;
    }
    key = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)paVar27->_M_allocated_capacity;
    paVar27->_M_allocated_capacity = 0;
    local_3e0._M_head_impl = (Expression *)key;
    local_398 = paVar27;
    if (LVar2 == SQLNULL) {
      puVar44 = &DAT_00000001;
      puVar43 = (undefined1 *)0x0;
    }
    else {
      LogicalType::LogicalType((LogicalType *)local_358,pLVar30);
      puVar45 = local_3b8 + (local_3b8 == (undefined1 *)0x0);
      puVar43 = (undefined1 *)0x0;
      do {
        puVar44 = puVar43;
        if ((string)local_358[0] != (string)0x65) break;
        pLVar29 = ListType::GetChildType((LogicalType *)local_358);
        auVar46 = local_358;
        if ((LogicalType *)local_358 != pLVar29) {
          uVar12 = pLVar29->id_;
          uVar13 = pLVar29->physical_type_;
          local_358[1] = uVar13;
          local_358[0] = uVar12;
          key = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)key & 0xffffffffffffff00);
          local_358._2_6_ = auVar46._2_6_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)auStack_350,&pLVar29->type_info_);
        }
        puVar43 = puVar43 + 1;
        puVar44 = puVar45;
      } while (puVar45 != puVar43);
      puVar43 = (undefined1 *)0x0;
      if ((string)local_358[0] == (string)0x64) {
        puVar43 = local_3b8 + -(long)puVar44;
      }
      LogicalType::~LogicalType((LogicalType *)local_358);
    }
    _Var3._M_head_impl = local_3e0._M_head_impl;
    if (puVar43 == (undefined1 *)0x0 || (char)local_39c != '\0') {
      local_2b0 = puVar43;
      LogicalType::LogicalType(&local_2a8,pLVar30);
      if (puVar44 != (undefined1 *)0x0) {
        puVar43 = (undefined1 *)0x0;
        do {
          if ((local_2a8.id_ == LIST) &&
             (pLVar30 = ListType::GetChildType(&local_2a8), &local_2a8 != pLVar30)) {
            local_2a8.id_ = pLVar30->id_;
            local_2a8.physical_type_ = pLVar30->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&local_2a8.type_info_,&pLVar30->type_info_);
          }
          this_02 = (BoundUnnestExpression *)operator_new(0x60);
          LogicalType::LogicalType((LogicalType *)local_358,&local_2a8);
          BoundUnnestExpression::BoundUnnestExpression(this_02,(LogicalType *)local_358);
          local_390._M_head_impl = this_02;
          LogicalType::~LogicalType((LogicalType *)local_358);
          pBVar31 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                    ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                  *)&local_390);
          _Var15._M_head_impl = local_3e0._M_head_impl;
          local_3e0._M_head_impl = (Expression *)0x0;
          _Var3._M_head_impl =
               (pBVar31->child).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pBVar31->child).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
          if (_Var3._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          sVar4 = (function->super_ParsedExpression).super_BaseExpression.alias._M_string_length;
          if (sVar4 == 0) {
            pBVar31 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                      ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                    *)&local_390);
            (*(pBVar31->super_Expression).super_BaseExpression._vptr_BaseExpression[8])
                      (&local_3d8,pBVar31);
          }
          else {
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            pcVar5 = (function->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>((string *)&local_3d8,pcVar5,pcVar5 + sVar4);
          }
          _Var16._M_head_impl = local_390._M_head_impl;
          p_Var36 = (_Hash_node_base *)(puVar44 + local_3b0->unnest_level + ~(ulong)puVar43);
          pBVar6 = (local_3b0->super_BaseSelectBinder).node;
          uVar39 = (pBVar6->unnests)._M_h._M_bucket_count;
          uVar35 = (ulong)p_Var36 % uVar39;
          p_Var7 = (pBVar6->unnests)._M_h._M_buckets[uVar35];
          p_Var32 = (__node_base_ptr)0x0;
          if ((p_Var7 != (__node_base_ptr)0x0) &&
             (p_Var32 = p_Var7, p_Var42 = p_Var7->_M_nxt, p_Var36 != p_Var7->_M_nxt[1]._M_nxt)) {
            while (p_Var41 = p_Var42->_M_nxt, p_Var41 != (_Hash_node_base *)0x0) {
              p_Var32 = (__node_base_ptr)0x0;
              if (((ulong)p_Var41[1]._M_nxt % uVar39 != uVar35) ||
                 (p_Var32 = p_Var42, p_Var42 = p_Var41, p_Var36 == p_Var41[1]._M_nxt))
              goto LAB_00da4c9c;
            }
            p_Var32 = (__node_base_ptr)0x0;
          }
LAB_00da4c9c:
          if (p_Var32 == (__node_base_ptr)0x0) {
            p_Var41 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var41 = p_Var32->_M_nxt;
          }
          if (p_Var41 == (_Hash_node_base *)0x0) {
            auStack_380._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            auStack_380._8_8_ = (pointer)0x0;
            auStack_380._16_8_ = (pointer)0x0;
            local_388 = (undefined1  [8])
                        Binder::GenerateTableIndex
                                  ((local_3b0->super_BaseSelectBinder).super_ExpressionBinder.binder
                                  );
            local_358 = (undefined1  [8])local_390._M_head_impl;
            local_390._M_head_impl = (BoundUnnestExpression *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)auStack_380,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_358)->_M_allocated_capacity);
            if (local_358 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_358 + 8))();
            }
            auVar46 = local_388;
            auStack_350 = local_388;
            local_348._0_8_ = auStack_380._0_8_;
            local_348._8_8_ = auStack_380._8_8_;
            local_348._16_8_ = auStack_380._16_8_;
            auStack_380._0_8_ = (pointer)0x0;
            auStack_380._8_8_ = (pointer)0x0;
            auStack_380._16_8_ = (pointer)0x0;
            local_358 = (undefined1  [8])p_Var36;
            ::std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::BoundUnnestNode>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,duckdb::BoundUnnestNode>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::BoundUnnestNode>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&((local_3b0->super_BaseSelectBinder).node)->unnests,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_358);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)local_348);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       *)auStack_380);
            auStack_350 = (undefined1  [8])0x0;
          }
          else {
            auVar46 = (undefined1  [8])p_Var41[2]._M_nxt;
            p_Var36 = p_Var41[4]._M_nxt;
            p_Var8 = p_Var41[3]._M_nxt;
            local_390._M_head_impl = (BoundUnnestExpression *)0x0;
            local_358 = (undefined1  [8])_Var16._M_head_impl;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)(p_Var41 + 3),
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_358)->_M_allocated_capacity);
            if (local_358 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_358 + 8))();
            }
            auStack_350 = (undefined1  [8])((long)p_Var36 - (long)p_Var8 >> 3);
          }
          key = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358;
          local_358 = auVar46;
          make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
                    ((duckdb *)local_388,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8
                     ,&local_2a8,(ColumnBinding *)local_358,&local_2b8);
          auVar46 = local_388;
          _Var3._M_head_impl = local_3e0._M_head_impl;
          local_388 = (undefined1  [8])0x0;
          local_3e0._M_head_impl = (Expression *)auVar46;
          if (_Var3._M_head_impl != (Expression *)0x0) {
            (*((_Var3._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          if (local_388 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_388 + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          if (local_390._M_head_impl != (BoundUnnestExpression *)0x0) {
            (*((local_390._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
              [1])();
          }
          puVar43 = puVar43 + 1;
        } while (puVar43 != puVar44);
      }
      if (local_2b0 != (undefined1 *)0x0) {
        local_3d8._M_dataplus._M_p = (pointer)0x0;
        local_3d8._M_string_length = 0;
        local_3d8.field_2._M_allocated_capacity = 0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_3d8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_3e0);
        puVar43 = (undefined1 *)0x0;
        do {
          local_388 = (undefined1  [8])0x0;
          auStack_380._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          auStack_380._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          if (local_3d8._M_dataplus._M_p == (pointer)local_3d8._M_string_length) {
            uVar38 = 1;
          }
          else {
            local_39c = 0;
            local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3d8._M_string_length;
            paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8._M_string_length;
            this_06._M_p = local_3d8._M_dataplus._M_p;
            local_3b8 = puVar43;
            do {
              pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)this_06._M_p);
              if ((pEVar28->return_type).id_ == STRUCT) {
                pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)this_06._M_p);
                pcVar33 = StructType::GetChildTypes_abi_cxx11_(&pEVar28->return_type);
                pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)this_06._M_p);
                bVar18 = StructType::IsUnnamed(&pEVar28->return_type);
                if (bVar18) {
                  key = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71((int7)((ulong)key >> 8),1);
                  local_39c = (uint)key;
                  puVar43 = local_3b8;
                  paVar27 = local_398;
                  if ((pcVar33->
                      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      ).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (pcVar33->
                      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      ).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    uVar39 = 0;
                    do {
                      pCVar9 = (local_3b0->super_BaseSelectBinder).super_ExpressionBinder.context;
                      pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                              *)this_06._M_p);
                      (*(pEVar28->super_BaseExpression)._vptr_BaseExpression[0x11])
                                (&local_2c0,pEVar28);
                      uVar39 = uVar39 + 1;
                      CreateBoundStructExtractIndex
                                ((duckdb *)local_358,pCVar9,
                                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  *)&local_2c0,uVar39);
                      ::std::
                      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      ::
                      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                  *)local_388,
                                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                  *)local_358);
                      if (local_358 != (undefined1  [8])0x0) {
                        (**(code **)(*(size_type *)local_358 + 8))();
                      }
                      local_358 = (undefined1  [8])0x0;
                      if (local_2c0._M_head_impl != (Expression *)0x0) {
                        (*((local_2c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])
                                  ();
                      }
                      local_2c0._M_head_impl = (Expression *)0x0;
                      key = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x6db6db6db6db6db7;
                      puVar43 = local_3b8;
                      paVar27 = local_398;
                    } while (uVar39 < (ulong)(((long)(pcVar33->
                                                                                                          
                                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ).
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(pcVar33->
                                                                                                          
                                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ).
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                             0x6db6db6db6db6db7));
                  }
                }
                else {
                  ppVar10 = (pcVar33->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  local_39c = (uint)CONCAT71(extraout_var,1);
                  for (ppVar37 = (pcVar33->
                                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                 ).
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; puVar43 = local_3b8,
                      paVar27 = local_398, ppVar37 != ppVar10; ppVar37 = ppVar37 + 1) {
                    pCVar9 = (local_3b0->super_BaseSelectBinder).super_ExpressionBinder.context;
                    pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                            *)this_06._M_p);
                    (*(pEVar28->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_360,pEVar28);
                    local_210._M_allocated_capacity = (size_type)&local_200;
                    pcVar5 = (ppVar37->first)._M_dataplus._M_p;
                    key = &local_210;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)key,pcVar5,pcVar5 + (ppVar37->first)._M_string_length);
                    CreateBoundStructExtract
                              ((duckdb *)local_358,pCVar9,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_360,(string *)key);
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    ::
                    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                                *)local_388,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_358);
                    if (local_358 != (undefined1  [8])0x0) {
                      (**(code **)(*(size_type *)local_358 + 8))();
                    }
                    local_358 = (undefined1  [8])0x0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_allocated_capacity != &local_200) {
                      operator_delete((void *)local_210._M_allocated_capacity);
                    }
                    if (local_360._M_head_impl != (Expression *)0x0) {
                      (*((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    local_360._M_head_impl = (Expression *)0x0;
                  }
                }
              }
              else {
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)local_388,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)this_06._M_p);
              }
              this_06._M_p = this_06._M_p + 8;
            } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)this_06._M_p != paVar27);
            uVar38 = local_39c ^ 1;
          }
          key = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)auStack_380._8_8_;
          local_348._0_8_ = local_3d8.field_2._M_allocated_capacity;
          auStack_350 = (undefined1  [8])local_3d8._M_string_length;
          local_358 = (undefined1  [8])local_3d8._M_dataplus._M_p;
          local_3d8._M_dataplus._M_p = (pointer)local_388;
          local_3d8._M_string_length = auStack_380._0_8_;
          local_3d8.field_2._M_allocated_capacity = auStack_380._8_8_;
          local_388 = (undefined1  [8])0x0;
          auStack_380._0_8_ = (pointer)0x0;
          auStack_380._8_8_ = (pointer)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_358);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     *)local_388);
        } while (((uVar38 & 1) == 0) && (puVar43 = puVar43 + 1, puVar43 != local_2b0));
        make_uniq<duckdb::BoundExpandedExpression,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                  ((duckdb *)local_358,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)&local_3d8);
        auVar46 = local_358;
        _Var3._M_head_impl = local_3e0._M_head_impl;
        local_358 = (undefined1  [8])0x0;
        local_3e0._M_head_impl = (Expression *)auVar46;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_head_impl !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)((pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)&(_Var3._M_head_impl)->super_BaseExpression)->
                                _M_allocated_capacity + 8))();
        }
        if (local_358 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_358 + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_3d8);
      }
      local_2c8._M_head_impl = local_3e0._M_head_impl;
      local_3e0._M_head_impl = (Expression *)0x0;
      BindResult::BindResult
                (local_3a8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)((pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&(local_2c8._M_head_impl)->super_BaseExpression)->
                              _M_allocated_capacity + 8))();
      }
      local_2c8._M_head_impl = (Expression *)0x0;
      LogicalType::~LogicalType(&local_2a8);
    }
    else {
      local_3e0._M_head_impl = (Expression *)0x0;
      plVar11 = (long *)local_398->_M_allocated_capacity;
      local_398->_M_allocated_capacity = (size_type)_Var3._M_head_impl;
      if (plVar11 != (long *)0x0) {
        (**(code **)(*plVar11 + 8))();
      }
      local_358 = (undefined1  [8])local_348;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,
                 "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"
                 ,"");
      BinderException::BinderException<>
                ((BinderException *)&local_3d8,&function->super_ParsedExpression,(string *)local_358
                );
      BindResult::BindResult(local_3a8,(Exception *)&local_3d8);
      ::std::runtime_error::~runtime_error((runtime_error *)&local_3d8);
      if (local_358 != (undefined1  [8])local_348) {
        operator_delete((void *)local_358);
      }
    }
    if (local_3e0._M_head_impl != (Expression *)0x0) {
      (*((local_3e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
LAB_00da4337:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&local_290 + 0x48));
  if (local_290.final_message._M_dataplus._M_p != (pointer)((long)&local_290 + 0x38U)) {
    operator_delete(local_290.final_message._M_dataplus._M_p);
  }
  _Var40._M_p = local_290.raw_message._M_dataplus._M_p;
  if (local_290.raw_message._M_dataplus._M_p == (pointer)((long)&local_290 + 0x18U)) {
    return local_3a8;
  }
LAB_00da422f:
  operator_delete(_Var40._M_p);
  return local_3a8;
}

Assistant:

BindResult SelectBinder::BindUnnest(FunctionExpression &function, idx_t depth, bool root_expression) {
	// bind the children of the function expression
	if (depth > 0) {
		return BindResult(BinderException(function, "UNNEST() for correlated expressions is not supported yet"));
	}

	ErrorData error;
	if (function.children.empty()) {
		return BindResult(BinderException(function, "UNNEST() requires a single argument"));
	}
	if (inside_window) {
		return BindResult(BinderException(function, UnsupportedUnnestMessage()));
	}

	if (function.distinct || function.filter || !function.order_bys->orders.empty()) {
		throw InvalidInputException("\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not "
		                            "applicable to \"UNNEST\"");
	}

	idx_t max_depth = 1;
	if (function.children.size() != 1) {
		bool has_parameter = false;
		bool supported_argument = false;
		for (idx_t i = 1; i < function.children.size(); i++) {
			if (has_parameter) {
				return BindResult(BinderException(function, "UNNEST() only supports a single additional argument"));
			}
			if (function.children[i]->HasParameter()) {
				throw ParameterNotAllowedException("Parameter not allowed in unnest parameter");
			}
			if (!function.children[i]->IsScalar()) {
				break;
			}
			auto alias = StringUtil::Lower(function.children[i]->GetAlias());
			BindChild(function.children[i], depth, error);
			if (error.HasError()) {
				return BindResult(std::move(error));
			}
			auto &const_child = BoundExpression::GetExpression(*function.children[i]);
			auto value = ExpressionExecutor::EvaluateScalar(context, *const_child, true);
			if (alias == "recursive") {
				auto recursive = value.GetValue<bool>();
				if (recursive) {
					max_depth = NumericLimits<idx_t>::Maximum();
				}
			} else if (alias == "max_depth") {
				max_depth = value.GetValue<uint32_t>();
				if (max_depth == 0) {
					throw BinderException("UNNEST cannot have a max depth of 0");
				}
			} else if (!alias.empty()) {
				throw BinderException("Unsupported parameter \"%s\" for unnest", alias);
			} else {
				break;
			}
			has_parameter = true;
			supported_argument = true;
		}
		if (!supported_argument) {
			return BindResult(BinderException(function, "UNNEST - unsupported extra argument, unnest only supports "
			                                            "recursive := [true/false] or max_depth := #"));
		}
	}
	unnest_level++;
	BindChild(function.children[0], depth, error);
	if (error.HasError()) {
		// failed to bind
		// try to bind correlated columns manually
		auto result = BindCorrelatedColumns(function.children[0], error);
		if (result.HasError()) {
			return BindResult(result.error);
		}
		auto &bound_expr = BoundExpression::GetExpression(*function.children[0]);
		ExtractCorrelatedExpressions(binder, *bound_expr);
	}
	auto &child = BoundExpression::GetExpression(*function.children[0]);
	auto &child_type = child->return_type;
	unnest_level--;

	if (unnest_level > 0) {
		throw BinderException(
		    function,
		    "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels");
	}

	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::LIST:
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::SQLNULL:
		break;
	default:
		return BindResult(BinderException(function, "UNNEST() can only be applied to lists, structs and NULL, not %s",
		                                  child_type.ToString()));
	}

	idx_t list_unnests;
	idx_t struct_unnests = 0;

	auto unnest_expr = std::move(child);
	if (child_type.id() == LogicalTypeId::SQLNULL) {
		list_unnests = 1;
	} else {
		// perform all LIST unnests
		auto type = child_type;
		list_unnests = 0;
		while (type.id() == LogicalTypeId::LIST) {
			type = ListType::GetChildType(type);
			list_unnests++;
			if (list_unnests >= max_depth) {
				break;
			}
		}
		// unnest structs
		if (type.id() == LogicalTypeId::STRUCT) {
			struct_unnests = max_depth - list_unnests;
		}
	}
	if (struct_unnests > 0 && !root_expression) {
		child = std::move(unnest_expr);
		return BindResult(BinderException(
		    function, "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"));
	}
	// perform all LIST unnests
	auto return_type = child_type;
	for (idx_t current_depth = 0; current_depth < list_unnests; current_depth++) {
		if (return_type.id() == LogicalTypeId::LIST) {
			return_type = ListType::GetChildType(return_type);
		}
		auto result = make_uniq<BoundUnnestExpression>(return_type);
		result->child = std::move(unnest_expr);
		auto alias = function.GetAlias().empty() ? result->ToString() : function.GetAlias();

		auto current_level = unnest_level + list_unnests - current_depth - 1;
		auto entry = node.unnests.find(current_level);
		idx_t unnest_table_index;
		idx_t unnest_column_index;
		if (entry == node.unnests.end()) {
			BoundUnnestNode unnest_node;
			unnest_node.index = binder.GenerateTableIndex();
			unnest_node.expressions.push_back(std::move(result));
			unnest_table_index = unnest_node.index;
			unnest_column_index = 0;
			node.unnests.insert(make_pair(current_level, std::move(unnest_node)));
		} else {
			unnest_table_index = entry->second.index;
			unnest_column_index = entry->second.expressions.size();
			entry->second.expressions.push_back(std::move(result));
		}
		// now create a column reference referring to the unnest
		unnest_expr = make_uniq<BoundColumnRefExpression>(
		    std::move(alias), return_type, ColumnBinding(unnest_table_index, unnest_column_index), depth);
	}
	// now perform struct unnests, if any
	if (struct_unnests > 0) {
		vector<unique_ptr<Expression>> struct_expressions;
		struct_expressions.push_back(std::move(unnest_expr));

		for (idx_t i = 0; i < struct_unnests; i++) {
			vector<unique_ptr<Expression>> new_expressions;
			// check if there are any structs left
			bool has_structs = false;
			for (auto &expr : struct_expressions) {
				if (expr->return_type.id() == LogicalTypeId::STRUCT) {
					// struct! push a struct_extract
					auto &child_types = StructType::GetChildTypes(expr->return_type);
					if (StructType::IsUnnamed(expr->return_type)) {
						for (idx_t child_index = 0; child_index < child_types.size(); child_index++) {
							new_expressions.push_back(
							    CreateBoundStructExtractIndex(context, expr->Copy(), child_index + 1));
						}
					} else {
						for (auto &entry : child_types) {
							new_expressions.push_back(CreateBoundStructExtract(context, expr->Copy(), entry.first));
						}
					}
					has_structs = true;
				} else {
					// not a struct - push as-is
					new_expressions.push_back(std::move(expr));
				}
			}
			struct_expressions = std::move(new_expressions);
			if (!has_structs) {
				break;
			}
		}
		unnest_expr = make_uniq<BoundExpandedExpression>(std::move(struct_expressions));
	}
	return BindResult(std::move(unnest_expr));
}